

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

SequenceRange __thiscall
slang::ast::SequenceRepetition::applyTo(SequenceRepetition *this,SequenceRange res)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  SequenceRange SVar6;
  _Storage<unsigned_int,_true> _Stack_c;
  
  uVar4 = res.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._4_4_;
  _Stack_c._M_value =
       res.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  lVar1 = (res._0_8_ & 0xffffffff) * (ulong)(this->range).min;
  uVar5 = 0xffffffff;
  if ((int)((ulong)lVar1 >> 0x20) == 0) {
    uVar5 = (undefined4)lVar1;
  }
  if (((undefined1  [12])res & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
    if ((this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      uVar2 = (res._0_8_ >> 0x20) *
              (ulong)(this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload._M_value;
      uVar3 = 0;
      if ((int)(uVar2 >> 0x20) == 0) {
        uVar3 = uVar2 & 0xffffffff | 0x100000000;
      }
      _Stack_c._M_value = (uint)uVar3;
      uVar4 = (undefined4)(uVar3 >> 0x20);
    }
    else {
      uVar4 = 0;
    }
  }
  SVar6.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_c._M_value;
  SVar6.min = uVar5;
  SVar6.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ = uVar4;
  return SVar6;
}

Assistant:

SequenceRange SequenceRepetition::applyTo(SequenceRange res) const {
    res.min = checkedMulU32(res.min, range.min).value_or(UINT32_MAX);
    if (res.max && range.max)
        res.max = checkedMulU32(*res.max, *range.max);
    else
        res.max.reset();

    return res;
}